

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffthdu(fitsfile *fptr,int *nhdu,int *status)

{
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int tstatus;
  int extnum;
  int ii;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int local_24;
  int local_4;
  
  if (*in_RDX < 1) {
    local_24 = *in_RDI;
    *in_RSI = local_24;
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
      local_4 = *in_RDX;
    }
    else {
      while( true ) {
        local_24 = local_24 + 1;
        iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
        if (0 < iVar1) break;
        *in_RSI = local_24;
      }
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffthdu(fitsfile *fptr,      /* I - FITS file pointer                    */
           int *nhdu,            /* O - number of HDUs in the file           */
           int *status)         /* IO - error status                        */
/*
  Return the number of HDUs that currently exist in the file.
*/
{
    int ii, extnum, tstatus;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */
    *nhdu = extnum - 1;

    /* if the CHDU is empty or not completely defined, just return */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        return(*status);

    tstatus = 0;

    /* loop until EOF */
    for (ii=extnum; ffmahd(fptr, ii, 0, &tstatus) <= 0; ii++)
    {
        *nhdu = ii;
    }

    ffmahd(fptr, extnum, 0, status);       /* restore orig file position */
    return(*status);
}